

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-0.c
# Opt level: O3

int feederBig1(void)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  uint uVar3;
  
  __s = fopen("in.txt","w+");
  if (__s == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
LAB_001026e7:
    iVar1 = -1;
  }
  else {
    fwrite("2000000\n",8,1,__s);
    uVar3 = 0;
    do {
      iVar1 = fprintf(__s,"%d ",(ulong)(uVar3 ^ 0xcafecafe));
      if (iVar1 < 0) {
        puts("can\'t create in.txt. No space on disk?");
        fclose(__s);
        goto LAB_001026e7;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 2000000);
    fputc(10,__s);
    fclose(__s);
    sVar2 = GetLabPointerSize();
    LabMemoryLimit = sVar2 * 4000000 + 0x1342400;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int feederBig1(void)
{
  FILE *const in = fopen("in.txt", "w+");
  unsigned i;
  if (!in) {
    printf("can't create in.txt. No space on disk?\n");
    return -1;
  }
  fprintf(in, "2000000\n");
  for (i = 0; i < 2000000; i++) {
    if (fprintf(in, "%d ", i^0xcafecafe) < 0) {
      printf("can't create in.txt. No space on disk?\n");
      fclose(in);
      return -1;
    }
  }
  fprintf(in, "\n");
  fclose(in);
  LabMemoryLimit = 2000000*(sizeof(int)+sizeof(int)+2*GetLabPointerSize())+MIN_PROCESS_RSS_BYTES;
  return 0;
}